

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

void __thiscall
rapidxml::xml_node<char>::append_attribute(xml_node<char> *this,xml_attribute<char> *attribute)

{
  xml_attribute<char> *pxVar1;
  xml_attribute<char> **ppxVar2;
  
  if ((attribute != (xml_attribute<char> *)0x0) &&
     ((attribute->super_xml_base<char>).m_parent == (xml_node<char> *)0x0)) {
    if (this->m_first_attribute == (xml_attribute<char> *)0x0) {
      ppxVar2 = &this->m_first_attribute;
      attribute->m_prev_attribute = (xml_attribute<char> *)0x0;
    }
    else {
      pxVar1 = this->m_last_attribute;
      attribute->m_prev_attribute = pxVar1;
      ppxVar2 = &pxVar1->m_next_attribute;
    }
    *ppxVar2 = attribute;
    this->m_last_attribute = attribute;
    (attribute->super_xml_base<char>).m_parent = this;
    attribute->m_next_attribute = (xml_attribute<char> *)0x0;
    return;
  }
  __assert_fail("attribute && !attribute->parent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                ,0x4c3,
                "void rapidxml::xml_node<>::append_attribute(xml_attribute<Ch> *) [Ch = char]");
}

Assistant:

void append_attribute(xml_attribute<Ch> *attribute)
        {
            assert(attribute && !attribute->parent());
            if (first_attribute())
            {
                attribute->m_prev_attribute = m_last_attribute;
                m_last_attribute->m_next_attribute = attribute;
            }
            else
            {
                attribute->m_prev_attribute = 0;
                m_first_attribute = attribute;
            }
            m_last_attribute = attribute;
            attribute->m_parent = this;
            attribute->m_next_attribute = 0;
        }